

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_encapsulationWithCycleDefined_Test::~Parser_encapsulationWithCycleDefined_Test
          (Parser_encapsulationWithCycleDefined_Test *this)

{
  Parser_encapsulationWithCycleDefined_Test *this_local;
  
  ~Parser_encapsulationWithCycleDefined_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, encapsulationWithCycleDefined)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <component name=\"bob\"/>\n"
        "  <component name=\"jim\"/>\n"
        "  <component name=\"dave\"/>\n"
        "  <component name=\"bob\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"bob\">\n"
        "      <component_ref component=\"jim\">\n"
        "        <component_ref component=\"dave\">\n"
        "          <component_ref component=\"bob\"/>\n"
        "        </component_ref>\n"
        "      </component_ref>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    const std::vector<std::string> expectedIssuesParser = {
        "Encapsulation in model 'model_name' specifies 'bob' as a component in a component_ref but it is not unique.",
    };

    const std::vector<std::string> expectedIssuesValidator = {
        "Model 'model_name' contains multiple components with the name 'bob'. Valid component names must be unique to their model.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    auto m = p->parseModel(in);

    EXPECT_EQ(size_t(1), p->issueCount());
    EXPECT_EQ_ISSUES(expectedIssuesParser, p);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    auto output = printer->printModel(m);
    EXPECT_EQ(output, in);

    libcellml::ValidatorPtr v = libcellml::Validator::create();
    v->validateModel(m);

    EXPECT_EQ_ISSUES(expectedIssuesValidator, v);
}